

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectInterfacePerModuleSource.cpp
# Opt level: O0

void __thiscall PerModuleInterface::PerModuleInterface(PerModuleInterface *this)

{
  PerModuleInterface *this_local;
  
  IPerModuleInterface::IPerModuleInterface(&this->super_IPerModuleInterface);
  (this->super_IPerModuleInterface)._vptr_IPerModuleInterface =
       (_func_int **)&PTR_GetConstructors_0011ace8;
  std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>::vector
            (&this->m_ObjectConstructors);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&this->m_RequiredSourceFiles);
  std::__cxx11::string::string((string *)&this->m_ModuleFilename);
  (*(this->super_IPerModuleInterface)._vptr_IPerModuleInterface[4])
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dtmoodie[P]RuntimeCompiledCPlusPlus/Aurora/RuntimeObjectSystem/ObjectInterfacePerModuleSource.cpp"
            );
  return;
}

Assistant:

PerModuleInterface::PerModuleInterface()
{
    //ensure this file gets compiled
    AddRequiredSourceFiles( __FILE__ );
}